

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O2

void Omega_h::enable_pooling(void)

{
  Pool *pPVar1;
  code *local_b0 [2];
  code *local_a0;
  code *local_98;
  code *local_90 [2];
  code *local_80;
  code *local_78;
  code *local_70 [2];
  code *local_60;
  code *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  pPVar1 = (Pool *)operator_new(0xc40);
  local_50[1] = (code *)0x0;
  local_50[0] = device_malloc;
  local_38 = std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_invoke;
  local_70[1] = (code *)0x0;
  local_40 = std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_manager;
  local_70[0] = device_free;
  local_58 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
             _M_invoke;
  local_60 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
             _M_manager;
  Pool::Pool(pPVar1,(MallocFunc *)local_50,(FreeFunc *)local_70);
  device_pool = pPVar1;
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  pPVar1 = (Pool *)operator_new(0xc40);
  local_90[1] = (code *)0x0;
  local_90[0] = host_malloc;
  local_78 = std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_invoke;
  local_80 = std::_Function_handler<void_*(unsigned_long),_void_*(*)(unsigned_long)>::_M_manager;
  local_b0[1] = (code *)0x0;
  local_b0[0] = host_free;
  local_98 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
             _M_invoke;
  local_a0 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
             _M_manager;
  Pool::Pool(pPVar1,(MallocFunc *)local_90,(FreeFunc *)local_b0);
  host_pool = pPVar1;
  std::_Function_base::~_Function_base((_Function_base *)local_b0);
  std::_Function_base::~_Function_base((_Function_base *)local_90);
  return;
}

Assistant:

void enable_pooling() {
  device_pool = new Pool(device_malloc, device_free);
  host_pool = new Pool(host_malloc, host_free);
}